

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::encode(string *filename,vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
                    uint w,uint h,LodePNGColorType colortype,uint bitdepth)

{
  bool bVar1;
  size_t sVar2;
  size_type sVar3;
  undefined8 local_48;
  uint bitdepth_local;
  LodePNGColorType colortype_local;
  uint h_local;
  uint w_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_local;
  string *filename_local;
  
  sVar2 = lodepng_get_raw_size_lct(w,h,colortype,bitdepth);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in);
  if (sVar3 < sVar2) {
    filename_local._4_4_ = 0x54;
  }
  else {
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(in);
    if (bVar1) {
      local_48 = (uchar *)0x0;
    }
    else {
      local_48 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in,0);
    }
    filename_local._4_4_ = encode(filename,local_48,w,h,colortype,bitdepth);
  }
  return filename_local._4_4_;
}

Assistant:

unsigned encode(const std::string& filename,
                const std::vector<unsigned char>& in, unsigned w, unsigned h,
                LodePNGColorType colortype, unsigned bitdepth) {
  if(lodepng_get_raw_size_lct(w, h, colortype, bitdepth) > in.size()) return 84;
  return encode(filename, in.empty() ? 0 : &in[0], w, h, colortype, bitdepth);
}